

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

void Str_NtkBalanceMulti2
               (Gia_Man_t *pNew,Str_Ntk_t *p,Str_Obj_t *pObj,Vec_Int_t *vDelay,int nLutSize)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = *(uint *)pObj;
  pObj->iCopy = (uint)((uVar2 & 0xf) == 3);
  if (0xf < uVar2) {
    uVar3 = 0;
    do {
      if ((uVar2 & 0xf) == 3) {
        uVar2 = pObj->iOffset + uVar3;
        if (((int)uVar2 < 0) || ((p->vFanins).nSize <= (int)uVar2)) {
LAB_007c9188:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar2 = (p->vFanins).pArray[uVar2];
        if ((int)uVar2 < 0) goto LAB_007c9169;
        if (p->nObjs <= (int)(uVar2 >> 1)) {
LAB_007c91c6:
          __assert_fail("i < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaStr.c"
                        ,0x52,"Str_Obj_t *Str_NtkObj(Str_Ntk_t *, int)");
        }
        uVar1 = p->pObjs[uVar2 >> 1].iCopy;
        if ((int)uVar1 < 0) {
LAB_007c91a7:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar2 = Gia_ManHashAnd(pNew,pObj->iCopy,uVar1 ^ uVar2 & 1);
      }
      else {
        uVar2 = pObj->iOffset + uVar3;
        if (((int)uVar2 < 0) || ((p->vFanins).nSize <= (int)uVar2)) goto LAB_007c9188;
        uVar2 = (p->vFanins).pArray[uVar2];
        if ((int)uVar2 < 0) goto LAB_007c9169;
        if (p->nObjs <= (int)(uVar2 >> 1)) goto LAB_007c91c6;
        uVar1 = p->pObjs[uVar2 >> 1].iCopy;
        if ((int)uVar1 < 0) goto LAB_007c91a7;
        uVar2 = Gia_ManHashXorReal(pNew,pObj->iCopy,uVar1 ^ uVar2 & 1);
      }
      pObj->iCopy = uVar2;
      if ((int)uVar2 < 0) {
LAB_007c9169:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      Str_ObjDelay(pNew,uVar2 >> 1,nLutSize,vDelay);
      uVar3 = uVar3 + 1;
      uVar2 = *(uint *)pObj;
    } while (uVar3 < uVar2 >> 4);
  }
  return;
}

Assistant:

void Str_NtkBalanceMulti2( Gia_Man_t * pNew, Str_Ntk_t * p, Str_Obj_t * pObj, Vec_Int_t * vDelay, int nLutSize )
{
    int k;
    pObj->iCopy = (pObj->Type == STR_AND);
    for ( k = 0; k < (int)pObj->nFanins; k++ )
    {
        if ( pObj->Type == STR_AND )
            pObj->iCopy = Gia_ManHashAnd( pNew, pObj->iCopy, Str_ObjFaninCopy(p, pObj, k) );
        else
            pObj->iCopy = Gia_ManHashXorReal( pNew, pObj->iCopy, Str_ObjFaninCopy(p, pObj, k) );
        Str_ObjDelay( pNew, Abc_Lit2Var(pObj->iCopy), nLutSize, vDelay );
    }
}